

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O2

err_t cmdFilePrepend(char *name,void *buf,size_t count)

{
  bool_t bVar1;
  err_t eVar2;
  file_t pFVar3;
  size_t offset;
  blob_t blob;
  size_t sVar4;
  size_t c;
  void *local_40;
  size_t count_local;
  
  count_local = count;
  pFVar3 = fileOpen(name,"r+b");
  if (pFVar3 == (file_t)0x0) {
    pFVar3 = fileOpen(name,"rb");
    if (pFVar3 == (file_t)0x0) {
      eVar2 = cmdFileWrite(name,buf,count);
      return eVar2;
    }
    fileClose(pFVar3);
    eVar2 = 0xcb;
  }
  else {
    offset = fileSize(pFVar3);
    if (offset == 0xffffffffffffffff) {
      fileClose(pFVar3);
      eVar2 = 0xcf;
    }
    else {
      blob = blobCreate(0x1000);
      if (blob == (blob_t)0x0) {
        fileClose(pFVar3);
        eVar2 = 0x6e;
      }
      else {
        eVar2 = 0;
        local_40 = buf;
        while ((eVar2 == 0 && (offset != 0))) {
          c = 0x1000;
          if (offset < 0x1000) {
            c = offset;
          }
          offset = offset - c;
          bVar1 = fileSeek(pFVar3,offset,0);
          eVar2 = 0xcf;
          if (((bVar1 != 0) && (sVar4 = fileRead2(blob,c,pFVar3), sVar4 == c)) &&
             (bVar1 = fileSeek(pFVar3,offset + count,0), bVar1 != 0)) {
            eVar2 = fileWrite(&c,blob,c,pFVar3);
          }
        }
        blobClose(blob);
        if (eVar2 == 0) {
          bVar1 = fileSeek(pFVar3,0,0);
          if (bVar1 == 0) {
            eVar2 = 0xcf;
          }
          else {
            eVar2 = fileWrite(&count_local,local_40,count,pFVar3);
            if (eVar2 == 0) {
              bVar1 = fileClose(pFVar3);
              if (bVar1 == 0) {
                return 0x67;
              }
              return 0;
            }
          }
        }
        fileClose(pFVar3);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t cmdFilePrepend(const char* name, const void* buf, size_t count)
{
	const size_t buf1_size = 4096;
	err_t code;
	file_t file;
	size_t size;
	size_t pos;
	void* buf1;
	// pre
	ASSERT(strIsValid(name));
	ASSERT(memIsValid(buf, count));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	if (code != ERR_OK)
	{
		// не открывается, но существует?
		code = cmdFileOpen(file, name, "rb");
		if (code == ERR_OK)
		{
			cmdFileClose(file);
			return ERR_FILE_OPEN;
		}
		// не существует => создать
		return cmdFileWrite(name, buf, count);
	}
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
	{
		cmdFileClose(file);
		return ERR_FILE_READ;
	}
	// сдвинуть содержимое файла вправо
	code = cmdBlobCreate(buf1, buf1_size);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	for (pos = size; code == ERR_OK && pos;)
	{
		size_t c;
		c = MIN2(buf1_size, pos), pos -= c;
		if (!fileSeek(file, pos, SEEK_SET) ||
			fileRead2(buf1, c, file) != c ||
			!fileSeek(file, pos + count, SEEK_SET))
			code = ERR_FILE_READ;
		else
			code = fileWrite(&c, buf1, c, file);
	}
	cmdBlobClose(buf1);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// дописать в начало
	if (!fileSeek(file, 0, SEEK_SET))
		code = ERR_FILE_READ;
	else
		code = fileWrite(&count, buf, count, file);
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}